

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WidgetDropDown.cpp
# Opt level: O2

int __thiscall
Rml::WidgetDropDown::AddOption
          (WidgetDropDown *this,String *rml,String *option_value,int before,bool select,
          bool selectable)

{
  Element *parent;
  _Head_base<0UL,_Rml::Element_*,_false> _Var1;
  int iVar2;
  ElementPtr element;
  _Head_base<0UL,_Rml::Element_*,_false> local_a8;
  allocator<char> local_9a;
  allocator<char> local_99;
  String local_98;
  int local_74;
  String local_70;
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> local_50;
  XMLAttributes local_48;
  
  parent = this->selection_element;
  local_74 = before;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"*",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"option",&local_9a);
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement((Factory *)&local_a8,parent,&local_98,&local_70,&local_48);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_48.m_container);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_98);
  Element::SetInnerRML(local_a8._M_head_impl,rml);
  _Var1._M_head_impl = local_a8._M_head_impl;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"value",(allocator<char> *)&local_70);
  Element::SetAttribute<std::__cxx11::string>(_Var1._M_head_impl,&local_98,option_value);
  ::std::__cxx11::string::~string((string *)&local_98);
  _Var1._M_head_impl = local_a8._M_head_impl;
  if (select) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"selected",(allocator<char> *)&local_48);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    Element::SetAttribute<std::__cxx11::string>(_Var1._M_head_impl,&local_98,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  _Var1._M_head_impl = local_a8._M_head_impl;
  if (!selectable) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"disabled",(allocator<char> *)&local_48);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    Element::SetAttribute<std::__cxx11::string>(_Var1._M_head_impl,&local_98,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  local_50._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
       (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
       (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)local_a8._M_head_impl;
  local_a8._M_head_impl = (Element *)0x0;
  iVar2 = AddOption(this,(ElementPtr *)&local_50,local_74);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_50);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_a8);
  return iVar2;
}

Assistant:

int WidgetDropDown::AddOption(const String& rml, const String& option_value, int before, bool select, bool selectable)
{
	ElementPtr element = Factory::InstanceElement(selection_element, "*", "option", XMLAttributes());
	element->SetInnerRML(rml);

	element->SetAttribute("value", option_value);

	if (select)
		element->SetAttribute("selected", String());
	if (!selectable)
		element->SetAttribute("disabled", String());

	int result = AddOption(std::move(element), before);

	return result;
}